

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::array<pbrt::WrapMode,_2>::array
          (array<pbrt::WrapMode,_2> *this,initializer_list<pbrt::WrapMode> v)

{
  const_iterator pWVar1;
  undefined4 *in_RDI;
  WrapMode *val;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<pbrt::WrapMode> *__range2;
  size_t i;
  initializer_list<pbrt::WrapMode> *this_00;
  undefined4 *local_48;
  const_iterator local_30;
  long local_20;
  initializer_list<pbrt::WrapMode> local_10;
  
  this_00 = (initializer_list<pbrt::WrapMode> *)(in_RDI + 2);
  local_48 = in_RDI;
  do {
    *local_48 = 0;
    local_48 = local_48 + 1;
  } while ((initializer_list<pbrt::WrapMode> *)local_48 != this_00);
  local_20 = 0;
  local_30 = std::initializer_list<pbrt::WrapMode>::begin(&local_10);
  pWVar1 = std::initializer_list<pbrt::WrapMode>::end(this_00);
  for (; local_30 != pWVar1; local_30 = local_30 + 1) {
    in_RDI[local_20] = *local_30;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    array(std::initializer_list<T> v) {
        size_t i = 0;
        for (const T &val : v)
            values[i++] = val;
    }